

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O3

string * __thiscall
iDynTree::ExternalMesh::getFileLocationOnLocalFileSystem_abi_cxx11_
          (string *__return_storage_ptr__,ExternalMesh *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __buckets_ptr pp_Var2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  istream *piVar7;
  FILE *pFVar8;
  pointer pbVar9;
  pointer pbVar10;
  pointer pcVar11;
  ulong uVar12;
  ulong uVar13;
  string *psVar14;
  __node_base _Var15;
  long *plVar16;
  long lVar17;
  bool bVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string individualPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListShare;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListPrefix;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathList;
  stringstream env_var_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_268;
  size_t local_260;
  undefined1 local_258 [40];
  pointer local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_1f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1f0;
  undefined1 local_1b8 [32];
  long *local_198 [2];
  long local_188 [10];
  ios_base local_138 [264];
  
  local_1f0._M_buckets = &local_1f0._M_single_bucket;
  local_1f0._M_bucket_count = 1;
  local_1f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1f0._M_element_count = 0;
  local_1f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1f0._M_rehash_policy._M_next_resize = 0;
  local_1f0._M_single_bucket = (__node_base_ptr)0x0;
  pbVar9 = (this->packageDirs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (this->packageDirs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_258._16_8_ = __return_storage_ptr__;
  if (pbVar9 == pbVar10) {
    pp_Var2 = (__buckets_ptr)(local_1b8 + 0x10);
    local_1b8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"GAZEBO_MODEL_PATH","");
    plVar16 = local_188;
    local_198[0] = plVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"ROS_PACKAGE_PATH","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_1b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_228,__l,(allocator_type *)&local_288);
    lVar17 = -0x40;
    do {
      if (plVar16 != (long *)plVar16[-2]) {
        operator_delete((long *)plVar16[-2],*plVar16 + 1);
      }
      plVar16 = plVar16 + -4;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0);
    local_1b8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"AMENT_PREFIX_PATH","");
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_1b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_210,__l_00,(allocator_type *)&local_288);
    local_258._24_8_ = this;
    if ((__buckets_ptr)local_1b8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    local_258._32_8_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      pbVar9 = local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar5 = getenv(pbVar9[uVar13]._M_dataplus._M_p);
        if (pcVar5 != (char *)0x0) {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          sVar6 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_288,pcVar5,pcVar5 + sVar6);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_288,_S_out|_S_in);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                     local_288.field_2._M_local_buf[0]) + 1);
          }
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          while( true ) {
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_1b8,(string *)&local_288,':');
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
            local_268 = &local_1f0;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_1f0,&local_288,&local_268);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                     local_288.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          local_258._32_8_ =
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pbVar9 = local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(local_258._32_8_ - (long)pbVar9 >> 5));
    }
    local_230 = local_210.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pbVar10 = (pointer)0x0;
      pbVar9 = local_210.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_258._32_8_ = pbVar10;
        pcVar5 = getenv(pbVar9[(long)pbVar10]._M_dataplus._M_p);
        if (pcVar5 != (char *)0x0) {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          sVar6 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_288,pcVar5,pcVar5 + sVar6);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_288,_S_out|_S_in);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                     local_288.field_2._M_local_buf[0]) + 1);
          }
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          while( true ) {
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_1b8,(string *)&local_288,':');
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
            local_268 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_258;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_268,local_288._M_dataplus._M_p,
                       local_288._M_dataplus._M_p + local_288._M_string_length);
            std::__cxx11::string::append((char *)&local_268);
            local_1f8 = &local_1f0;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_1f0,(string *)&local_268,&local_1f8);
            if (local_268 !=
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_258) {
              operator_delete(local_268,local_258._0_8_ + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                     local_288.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          local_230 = local_210.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pbVar9 = local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        pbVar10 = (pointer)((long)&((_Alloc_hider *)local_258._32_8_)->_M_p + 1);
      } while (pbVar10 < (pointer)((long)local_230 - (long)pbVar9 >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_210);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_228);
    this = (ExternalMesh *)local_258._24_8_;
  }
  else {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1b8,pbVar9,pbVar10,0,&local_288,&local_268,&local_228);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_M_move_assign(&local_1f0,local_1b8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_1b8);
  }
  local_268 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"package:/","");
  pFVar8 = fopen((this->filename)._M_dataplus._M_p,"r");
  if (pFVar8 == (FILE *)0x0) {
    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&this->filename);
    uVar3 = local_1b8._0_8_;
    if (local_1b8._8_8_ == local_260) {
      if (local_1b8._8_8_ == 0) {
        bVar18 = true;
      }
      else {
        iVar4 = bcmp((void *)local_1b8._0_8_,local_268,local_1b8._8_8_);
        bVar18 = iVar4 == 0;
      }
    }
    else {
      bVar18 = false;
    }
    if ((undefined1 *)uVar3 != local_1b8 + 0x10) {
      operator_delete((void *)uVar3,(ulong)(local_1b8._16_8_ + 1));
    }
    if (bVar18) {
      pcVar11 = (this->filename)._M_dataplus._M_p;
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,pcVar11,pcVar11 + (this->filename)._M_string_length);
      std::__cxx11::string::erase((ulong)local_1b8,0);
      bVar18 = true;
      if (local_1f0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_258._16_8_ + 0x10);
        _Var15._M_nxt = local_1f0._M_before_begin._M_nxt;
        local_258._24_8_ = this;
        do {
          std::operator+(&local_288,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (_Var15._M_nxt + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8);
          psVar14 = (string *)local_258._16_8_;
          ((_Alloc_hider *)local_258._16_8_)->_M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_258._16_8_,local_288._M_dataplus._M_p,
                     local_288._M_dataplus._M_p + local_288._M_string_length);
          uVar13 = *(size_type *)((long)psVar14 + 8);
          if (uVar13 != 0) {
            pcVar11 = (psVar14->_M_dataplus)._M_p;
            uVar12 = 0;
            do {
              if (pcVar11[uVar12] == '\\') {
                pcVar11[uVar12] = '/';
                pcVar11 = (psVar14->_M_dataplus)._M_p;
                uVar13 = *(size_type *)((long)psVar14 + 8);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < uVar13);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                     local_288.field_2._M_local_buf[0]) + 1);
            psVar14 = (string *)local_258._16_8_;
          }
          pFVar8 = fopen((psVar14->_M_dataplus)._M_p,"r");
          if (pFVar8 != (FILE *)0x0) {
            fclose(pFVar8);
            bVar18 = false;
            this = (ExternalMesh *)local_258._24_8_;
            goto LAB_0016300c;
          }
          pcVar11 = (psVar14->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar11 != paVar1) {
            operator_delete(pcVar11,paVar1->_M_allocated_capacity + 1);
          }
          _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt;
        } while (_Var15._M_nxt != (_Hash_node_base *)0x0);
        bVar18 = true;
        this = (ExternalMesh *)local_258._24_8_;
      }
LAB_0016300c:
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
      }
      if (!bVar18) goto LAB_00163051;
    }
  }
  else {
    fclose(pFVar8);
  }
  ((_Alloc_hider *)local_258._16_8_)->_M_p = (pointer)(local_258._16_8_ + 0x10);
  pcVar11 = (this->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258._16_8_,pcVar11,pcVar11 + (this->filename)._M_string_length);
LAB_00163051:
  if (local_268 !=
      (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)local_258) {
    operator_delete(local_268,local_258._0_8_ + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1f0);
  return (string *)local_258._16_8_;
}

Assistant:

std::string ExternalMesh::getFileLocationOnLocalFileSystem() const
    {
        bool isWindows = false;
    #ifdef _WIN32
        isWindows = true;
    #endif

        std::unordered_set<std::string> pathList;

        // if the user provides the packageDirs we do not check inside the dirs listed in the
        // environment variables
        if (!this->packageDirs.empty())
        {
            pathList = std::unordered_set<std::string>(this->packageDirs.begin(),
                                                       this->packageDirs.end());
        } else {
            // List of variables that contain <prefix>/share paths
            std::vector<std::string> envListShare = {"GAZEBO_MODEL_PATH", "ROS_PACKAGE_PATH"};
            // List of variables that contains <prefix> paths (to which /share needs to be added)
            std::vector<std::string> envListPrefix = {"AMENT_PREFIX_PATH"};

            for (size_t i = 0; i < envListShare.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListShare[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath);
                    }
                }
            }

            for (size_t i = 0; i < envListPrefix.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListPrefix[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath + "/share");
                    }
                }
            }
        }
        auto cleanPathSeparator = [isWindows](const std::string& filename)->std::string
        {
            std::string output = filename;
            char pathSeparator = isWindows ? '\\' : '/';
            char wrongPathSeparator = isWindows ? '/' : '\\';

            for (size_t i = 0; i < output.size(); ++i)
            {
                if (output[i] == wrongPathSeparator)
                {
                    output[i] = pathSeparator;
                }
            }

            return output;

        };

        auto isFileExisting = [](const std::string& filename)->bool
        {
            if (FILE *file = fopen(filename.c_str(), "r")) {
                fclose(file);
                return true;
            } else {
                return false;
            }
        };

        auto getFilePath = [isFileExisting, cleanPathSeparator](const std::string& filename, const std::string& prefixToRemove, const std::unordered_set<std::string>& paths)
        {
            if(isFileExisting(filename))
            {
                return filename;
            }

            if (filename.substr(0, prefixToRemove.size()) == prefixToRemove)
            {
                std::string filename_noprefix = filename;
                filename_noprefix.erase(0, prefixToRemove.size());
                for (const std::string& path : paths)
                {
                    const std::string testPath  = cleanPathSeparator(path + filename_noprefix);
                    if (isFileExisting(testPath))
                    {
                        return testPath;
                    }
                }

            }

            return filename; //By default return the input;
        };

        return getFilePath(filename, "package:/", pathList);
    }